

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

QAccessibleInterface * __thiscall
QAccessibleComboBox::childAt(QAccessibleComboBox *this,int x,int y)

{
  QWidgetData *pQVar1;
  bool bVar2;
  char cVar3;
  QComboBox *this_00;
  QLineEdit *pQVar4;
  QAccessibleInterface *pQVar5;
  long in_FS_OFFSET;
  QPoint local_40;
  undefined8 local_38;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  if (this_00 != (QComboBox *)0x0) {
    bVar2 = QComboBox::isEditable(this_00);
    if (bVar2) {
      pQVar4 = QComboBox::lineEdit(this_00);
      pQVar1 = (pQVar4->super_QWidget).data;
      local_38 = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                          (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
      local_40.xp.m_i = 0;
      local_40.yp.m_i = 0;
      pQVar5 = (QAccessibleInterface *)0x0;
      local_30 = x;
      local_2c = y;
      cVar3 = QRect::contains(&local_40,SUB81(&local_30,0));
      if (cVar3 != '\0') {
        pQVar5 = (QAccessibleInterface *)
                 (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x48))(this,1);
      }
      goto LAB_0051f923;
    }
  }
  pQVar5 = (QAccessibleInterface *)0x0;
LAB_0051f923:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleComboBox::childAt(int x, int y) const
{
    if (QComboBox *cBox = comboBox()) {
        if (cBox->isEditable() && cBox->lineEdit()->rect().contains(x, y))
            return child(1);
    }
    return nullptr;
}